

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineMapper.h
# Opt level: O1

tuple<double,_long,_double,_long> * __thiscall
anurbs::PolylineMapper<3L>::map
          (tuple<double,_long,_double,_long> *__return_storage_ptr__,PolylineMapper<3L> *this,
          Vector *point,double tolerance)

{
  long lVar1;
  pointer pMVar2;
  bool bVar3;
  tuple<double,_long,_double,_long> *ptVar4;
  Index i;
  long lVar5;
  pointer plVar6;
  double dVar7;
  double dVar8;
  double dVar10;
  undefined1 auVar9 [16];
  vector<long,_std::allocator<long>_> indices;
  Vector box_b;
  Vector box_a;
  Vector line_b;
  Vector line_a;
  double local_168;
  vector<long,_std::allocator<long>_> local_160;
  double local_148 [4];
  double local_128 [3];
  tuple<double,_long,_double,_long> *local_110;
  undefined1 local_108 [16];
  _Any_data local_f8;
  code *local_e8;
  undefined8 uStack_e0;
  double local_d8;
  Vector local_c8;
  Vector local_a8;
  pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> local_88;
  Vector local_68;
  Vector local_48;
  
  local_128[2] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[2];
  local_128[0] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[0];
  local_128[1] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[1];
  local_148[2] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[2];
  local_148[0] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[0];
  local_148[1] = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[1];
  lVar5 = 0;
  do {
    local_128[lVar5] = local_128[lVar5] + tolerance;
    local_148[lVar5] = local_148[lVar5] - tolerance;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_128[0];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       local_128[1];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_128[2];
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_148[0];
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       local_148[1];
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_148[2];
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e8 = (code *)0x0;
  uStack_e0 = 0;
  local_d8 = tolerance;
  RTree<3L>::by_box(&local_160,&this->m_rtree,&local_48,&local_68,(Callback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  local_110 = __return_storage_ptr__;
  if (local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_168 = 0.0;
    lVar5 = 0;
  }
  else {
    local_168 = 0.0;
    local_108 = ZEXT816(0x7ff0000000000000);
    lVar5 = 0;
    plVar6 = local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      lVar1 = *plVar6;
      pMVar2 = (this->m_points).
               super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = *(double *)
             ((long)&pMVar2[lVar1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage + 0x10);
      local_a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = *(double *)
             &pMVar2[lVar1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage;
      local_a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [1] = *(double *)
             ((long)&pMVar2[lVar1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage + 8);
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = *(double *)
             ((long)&pMVar2[lVar1 + 1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage + 0x10);
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = *(double *)
             &pMVar2[lVar1 + 1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage;
      local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [1] = *(double *)
             ((long)&pMVar2[lVar1 + 1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage + 8);
      Line<3L>::closest_point(&local_88,point,&local_a8,&local_c8,false);
      dVar7 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
              .array[0] -
              local_88.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
              .m_data.array[0];
      dVar10 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
               m_data.array[1] -
               local_88.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
               m_storage.m_data.array[1];
      dVar8 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
              .array[2] -
              local_88.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
              .m_data.array[2];
      auVar9._0_8_ = dVar8 * dVar8 + dVar10 * dVar10 + dVar7 * dVar7;
      auVar9._8_8_ = 0;
      auVar9 = sqrtpd(auVar9,auVar9);
      bVar3 = auVar9._0_8_ <= (double)local_108._0_8_;
      if (bVar3 && auVar9._0_8_ <= local_d8) {
        local_168 = local_88.first;
        lVar5 = lVar1;
        local_108 = auVar9;
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  ptVar4 = local_110;
  (local_110->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl = lVar5 + 1;
  (local_110->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Head_base<2UL,_double,_false>._M_head_impl = local_168;
  (local_110->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Tuple_impl<1UL,_long,_double,_long>.super__Head_base<1UL,_long,_false>._M_head_impl = lVar5
  ;
  (local_110->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Head_base<0UL,_double,_false>._M_head_impl = 1.0 - local_168;
  if (local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return ptVar4;
}

Assistant:

std::tuple<double, Index, double, Index> map(const Vector point, const double tolerance)
    {
        Vector box_a = point;
        Vector box_b = point;
        
        for (Index i = 0; i < TDimension; i++) {
            box_a[i] += tolerance;
            box_b[i] -= tolerance;
        }

        const auto indices = m_rtree.by_box(box_a, box_b);

        double closest_distance = Infinity;
        double closest_parameter = 0;
        Index closest_index = 0;

        for (const Index i : indices) {
            Vector line_a = m_points[i];
            Vector line_b = m_points[i + 1];

            const auto [t, cp] = Line<TDimension>::closest_point(point, line_a, line_b);

            const double distance = (point - cp).norm();

            if (distance > closest_distance || distance > tolerance) {
                continue;
            }
            
            closest_distance = distance;
            closest_parameter = t;
            closest_index = i;
        }

        return {1.0 - closest_parameter, closest_index, closest_parameter, closest_index + 1};
    }